

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O0

tuple<NS_*,_NS_*,_NS_*,_NS_*> * test_graphs::nested_rewrite_example(void)

{
  NS **__elements_1;
  NS *graph;
  tuple<NS_*,_NS_*,_NS_*,_NS_*> *this;
  NS *rest;
  N *this_00;
  NS *pNVar1;
  NS *first;
  NS *this_01;
  NS *rest_1;
  NS *rest_00;
  NS *first_00;
  NS *this_02;
  void *pvVar2;
  NS *rest_3;
  N *this_03;
  tuple<NS_*,_NS_*,_NS_*,_NS_*> *in_RDI;
  N *w;
  N *z;
  N *y;
  N *x;
  N *child;
  N *father;
  N *mother;
  N *t1s;
  type *t5n;
  type *h4n;
  type *h3n;
  type *h2n;
  type *h1n;
  type *t3n;
  type *g2n;
  type *g1n;
  type *t1n;
  type *f1n;
  NS *t5;
  NS *h4;
  NS *h3;
  NS *h2;
  NS *h1;
  NS *t3;
  NS *g2;
  NS *g1;
  NS *t1;
  NS *f1;
  NS *four_neighbours;
  NS *two_neighbours;
  NS *one_neighbour;
  N *neighbour;
  NS *context;
  NS *in_stack_fffffffffffffd58;
  size_t in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  N *in_stack_fffffffffffffd70;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_1c8;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_1c0;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_1b8;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> local_1b0;
  sockaddr *local_1a8;
  undefined8 local_1a0;
  void *local_198;
  void *local_190;
  sockaddr *local_188;
  undefined8 local_180;
  N *local_178;
  void *local_170;
  void *local_168;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*>_> local_160;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*>_> local_158;
  sockaddr *local_150;
  undefined8 local_148;
  void *local_140;
  __tuple_element_t<0UL,_tuple<N_*,_N_*>_> local_138;
  sockaddr *local_130;
  undefined8 local_128;
  __tuple_element_t<4UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_120;
  __tuple_element_t<3UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_118;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_110;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_108;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*,_N_*,_N_*>_> *local_100;
  __tuple_element_t<2UL,_tuple<N_*,_N_*,_N_*>_> *local_d0;
  __tuple_element_t<1UL,_tuple<N_*,_N_*,_N_*>_> *local_c8;
  __tuple_element_t<0UL,_tuple<N_*,_N_*,_N_*>_> *local_c0;
  __tuple_element_t<1UL,_tuple<N_*,_N_*>_> *local_a0;
  __tuple_element_t<0UL,_tuple<N_*,_N_*>_> *local_98;
  NS *local_80;
  void *local_78;
  void *local_70;
  NS *local_68;
  NS *local_60;
  NS *local_58;
  NS *local_50;
  NS *local_48;
  NS *local_40;
  NS *local_38;
  N *local_30;
  NS *local_28;
  tuple<NS_*,_NS_*,_NS_*,_NS_*> *local_20;
  NS *local_18;
  NS **local_10;
  
  __elements_1 = (NS **)operator_new(0x18);
  memset(__elements_1,0,0x18);
  NS::NS((NS *)0x19b37a);
  local_10 = __elements_1;
  graph = (NS *)N::operator_new(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  N::N<char_const*>(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_18 = graph;
  this = (tuple<NS_*,_NS_*,_NS_*,_NS_*> *)operator_new(0x18);
  memset(this,0,0x18);
  NS::NS((NS *)0x19b3e2);
  local_20 = this;
  rest = (NS *)operator_new(0x18);
  memset(rest,0,0x18);
  NS::NS((NS *)0x19b417);
  local_28 = rest;
  this_00 = (N *)operator_new(0x18);
  memset(this_00,0,0x18);
  NS::NS((NS *)0x19b44c);
  local_30 = this_00;
  pNVar1 = (NS *)operator_new(0x18);
  memset(pNVar1,0,0x18);
  NS::NS((NS *)0x19b481);
  local_38 = pNVar1;
  first = (NS *)operator_new(0x18);
  memset(first,0,0x18);
  NS::NS((NS *)0x19b4b6);
  local_40 = first;
  this_01 = (NS *)operator_new(0x18);
  memset(this_01,0,0x18);
  NS::NS((NS *)0x19b4eb);
  local_48 = this_01;
  rest_1 = (NS *)operator_new(0x18);
  memset(rest_1,0,0x18);
  NS::NS((NS *)0x19b520);
  local_50 = rest_1;
  rest_00 = (NS *)operator_new(0x18);
  memset(rest_00,0,0x18);
  NS::NS((NS *)0x19b555);
  local_58 = rest_00;
  first_00 = (NS *)operator_new(0x18);
  memset(first_00,0,0x18);
  NS::NS((NS *)0x19b58a);
  local_60 = first_00;
  this_02 = (NS *)operator_new(0x18);
  memset(this_02,0,0x18);
  NS::NS((NS *)0x19b5bf);
  local_68 = this_02;
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x19b5f4);
  local_70 = pvVar2;
  pvVar2 = operator_new(0x18);
  memset(pvVar2,0,0x18);
  NS::NS((NS *)0x19b629);
  local_78 = pvVar2;
  rest_3 = (NS *)operator_new(0x18);
  memset(rest_3,0,0x18);
  NS::NS((NS *)0x19b65e);
  local_80 = rest_3;
  NS::wrap<NS*,NS*>(pNVar1,(NS *)this_00,rest);
  local_98 = std::get<0ul,N*,N*>((tuple<N_*,_N_*> *)0x19b69d);
  local_a0 = std::get<1ul,N*,N*>((tuple<N_*,_N_*> *)0x19b6b2);
  NS::wrap<NS*,NS*,NS*>(this_01,first,pNVar1,(NS *)this_00);
  local_c0 = std::get<0ul,N*,N*,N*>((tuple<N_*,_N_*,_N_*> *)0x19b6f4);
  local_c8 = std::get<1ul,N*,N*,N*>((tuple<N_*,_N_*,_N_*> *)0x19b709);
  local_d0 = std::get<2ul,N*,N*,N*>((tuple<N_*,_N_*,_N_*> *)0x19b71e);
  pNVar1 = local_80;
  NS::wrap<NS*,NS*,NS*,NS*,NS*>(this_02,first_00,rest_00,rest_1,this_01,rest_3);
  local_100 = std::get<0ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x19b774);
  local_108 = std::get<1ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x19b789);
  local_110 = std::get<2ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x19b79e);
  local_118 = std::get<3ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x19b7b3);
  local_120 = std::get<4ul,N*,N*,N*,N*,N*>((tuple<N_*,_N_*,_N_*,_N_*,_N_*> *)0x19b7c8);
  local_138 = *local_98;
  local_130 = (sockaddr *)&local_138;
  local_128 = 1;
  N::connect(*local_a0,(int)local_18,local_130,1);
  pvVar2 = N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,(char *)rest);
  local_160 = *local_c0;
  local_158 = *local_c8;
  local_150 = (sockaddr *)&local_160;
  local_148 = 2;
  local_140 = pvVar2;
  N::connect(*local_d0,(int)local_18,local_150,2);
  pvVar2 = N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,(char *)rest);
  local_168 = pvVar2;
  pvVar2 = N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,(char *)rest);
  local_170 = pvVar2;
  this_03 = (N *)N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,(char *)rest);
  local_198 = local_168;
  local_190 = local_170;
  local_188 = (sockaddr *)&local_198;
  local_180 = 2;
  local_178 = this_03;
  N::connect(this_03,(int)local_18,local_188,2);
  local_1c8 = *local_100;
  local_1c0 = *local_108;
  local_1b8 = *local_110;
  local_1b0 = *local_118;
  local_1a8 = (sockaddr *)&local_1c8;
  local_1a0 = 4;
  N::connect(*local_120,(int)local_18,local_1a8,4);
  N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,(char *)rest);
  N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,(char *)rest);
  N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,(char *)rest);
  N::operator_new((size_t)this,graph);
  N::N<char_const*>(this_00,(char *)rest);
  std::tuple<NS_*,_NS_*,_NS_*,_NS_*>::tuple<NS_*&,_NS_*&,_NS_*&,_NS_*&,_true,_true>
            (this,(NS **)graph,__elements_1,(NS **)pNVar1,(NS **)0x19bb77);
  return in_RDI;
}

Assistant:

std::tuple<NS*, NS*, NS*, NS*> test_graphs::nested_rewrite_example() {
    auto context = new NS();
    auto neighbour = new(context) N("");
    auto one_neighbour = new NS(), two_neighbours = new NS(), four_neighbours = new NS();
    auto f1 = new NS(), t1 = new NS(), g1 = new NS(), g2 = new NS(), t3 = new NS(), h1 = new NS(), h2 = new NS(), h3 = new NS(), h4 = new NS(), t5 = new NS();
    auto [f1n, t1n] = one_neighbour->wrap(f1, t1); auto [g1n, g2n, t3n] = two_neighbours->wrap(g1, g2, t3); auto [h1n, h2n, h3n, h4n, t5n] = four_neighbours->wrap(h1, h2, h3, h4, t5);

    t1n->connect(neighbour, {f1n});
    auto t1s = new(f1) N("Lonely citizen");

    t3n->connect(neighbour, {g1n, g2n});
    auto mother = new(g1) N("Mother");
    auto father = new(g2) N("Father");
    auto child = new(g1) N("Child");
    child->connect(neighbour, {mother, father});

    t5n->connect(neighbour, {h1n, h2n, h3n, h4n});
    auto x = new(h1) N("Citizen");
    auto y = new(h2) N("Citizen");
    auto z = new(h3) N("Citizen");
    auto w = new(h4) N("Citizen");

    return {context, one_neighbour, two_neighbours, four_neighbours};
}